

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O2

void upb_Decoder_AddMessageSetItem
               (upb_Decoder *d,upb_Message *msg,upb_MiniTable *t,uint32_t type_id,char *data,
               uint32_t size)

{
  _Bool _Var1;
  upb_CType uVar2;
  upb_DecodeStatus status;
  upb_MiniTableExtension *e;
  upb_Extension *puVar3;
  upb_Message *msg_00;
  char *pcVar4;
  char *pcVar5;
  upb_MiniTable *mt;
  char buf [30];
  upb_StringView local_68;
  char *local_58;
  ulong local_50;
  char *local_48;
  long local_40;
  
  e = upb_ExtensionRegistry_Lookup(d->extreg,t,type_id);
  if (e == (upb_MiniTableExtension *)0x0) {
    pcVar4 = upb_Decoder_EncodeVarint32(0xb,buf);
    pcVar4 = upb_Decoder_EncodeVarint32(0x10,pcVar4);
    pcVar4 = upb_Decoder_EncodeVarint32(type_id,pcVar4);
    pcVar4 = upb_Decoder_EncodeVarint32(0x1a,pcVar4);
    pcVar4 = upb_Decoder_EncodeVarint32(size,pcVar4);
    pcVar5 = upb_Decoder_EncodeVarint32(0xc,pcVar4);
    local_68.size = (long)pcVar4 - (long)buf;
    local_40 = (long)pcVar5 - (long)pcVar4;
    local_68.data = buf;
    local_58 = data;
    local_50 = (ulong)size;
    local_48 = pcVar4;
    _Var1 = _upb_Message_AddUnknownV_dont_copy_me__upb_internal_use_only
                      (msg,&(d->field_7).arena,&local_68,3);
    if (!_Var1) goto LAB_002bc0c2;
  }
  else {
    puVar3 = _upb_Message_GetOrCreateExtension_dont_copy_me__upb_internal_use_only
                       (msg,e,&(d->field_7).arena);
    if (puVar3 == (upb_Extension *)0x0) {
LAB_002bc0c2:
      _upb_Decoder_ErrorJmp(d,kUpb_DecodeStatus_OutOfMemory);
    }
    msg_00 = _upb_Decoder_NewSubMessage2
                       (d,(puVar3->ext->sub_dont_copy_me__upb_internal_use_only).
                          submsg_dont_copy_me__upb_internal_use_only,
                        &puVar3->ext->field_dont_copy_me__upb_internal_use_only,
                        (upb_TaggedMessagePtr *)&(puVar3->data).uint32_val);
    uVar2 = upb_MiniTableField_CType(&e->field_dont_copy_me__upb_internal_use_only);
    if (uVar2 == kUpb_CType_Message) {
      mt = (e->sub_dont_copy_me__upb_internal_use_only).submsg_dont_copy_me__upb_internal_use_only;
    }
    else {
      mt = (upb_MiniTable *)0x0;
    }
    status = upb_Decode(data,(ulong)size,msg_00,mt,d->extreg,(uint)d->options,&(d->field_7).arena);
    if (status != kUpb_DecodeStatus_Ok) {
      _upb_Decoder_ErrorJmp(d,status);
    }
  }
  return;
}

Assistant:

static void upb_Decoder_AddMessageSetItem(upb_Decoder* d, upb_Message* msg,
                                          const upb_MiniTable* t,
                                          uint32_t type_id, const char* data,
                                          uint32_t size) {
  const upb_MiniTableExtension* item_mt =
      upb_ExtensionRegistry_Lookup(d->extreg, t, type_id);
  if (item_mt) {
    upb_Decoder_AddKnownMessageSetItem(d, msg, item_mt, data, size);
  } else {
    upb_Decoder_AddUnknownMessageSetItem(d, msg, type_id, data, size);
  }
}